

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPage::setButtonText(QWizardPage *this,WizardButton which,QString *text)

{
  QWizard *this_00;
  QAbstractButton *this_01;
  QWizardPage *pQVar1;
  long in_FS_OFFSET;
  WizardButton local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = which;
  QMap<int,_QString>::insert
            ((QMap<int,_QString> *)(*(long *)&(this->super_QWidget).field_0x8 + 0x310),&local_24,
             text);
  this_00 = *(QWizard **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (this_00 != (QWizard *)0x0) {
    pQVar1 = QWizard::currentPage(this_00);
    if ((pQVar1 == this) &&
       (this_01 = *(QAbstractButton **)
                   (*(long *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 8) +
                    0x420 + (long)which * 8), this_01 != (QAbstractButton *)0x0)) {
      QAbstractButton::setText(this_01,text);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setButtonText(QWizard::WizardButton which, const QString &text)
{
    Q_D(QWizardPage);
    d->buttonCustomTexts.insert(which, text);
    if (wizard() && wizard()->currentPage() == this && wizard()->d_func()->btns[which])
        wizard()->d_func()->btns[which]->setText(text);
}